

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
          (IfcGeometricRepresentationItem *this)

{
  *(undefined ***)
   &(this->super_IfcRepresentationItem).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(char **)&this->field_0x30 = "IfcGeometricRepresentationItem";
  IfcRepresentationItem::IfcRepresentationItem
            (&this->super_IfcRepresentationItem,&PTR_construction_vtable_24__0076b820);
  (this->super_IfcRepresentationItem).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x76b7b8;
  *(undefined8 *)
   &(this->super_IfcRepresentationItem).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x76b808;
  *(undefined8 *)
   &(this->super_IfcRepresentationItem).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x76b7e0;
  return;
}

Assistant:

IfcGeometricRepresentationItem() : Object("IfcGeometricRepresentationItem") {}